

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_striped_sse2_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sw_trace_striped_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  undefined8 *puVar2;
  int *piVar3;
  uint *puVar4;
  uint uVar5;
  void *pvVar6;
  parasail_matrix_t *ppVar7;
  bool bVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar18;
  __m128i *b_00;
  __m128i *palVar19;
  __m128i *ptr;
  __m128i *ptr_00;
  long lVar20;
  void *pvVar21;
  int iVar22;
  __m128i *palVar23;
  ulong uVar24;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  __m128i *palVar25;
  long lVar26;
  long lVar27;
  uint a;
  long lVar28;
  int iVar29;
  ulong uVar30;
  int iVar31;
  ulong uVar32;
  __m128i *ptr_01;
  bool bVar33;
  uint uVar34;
  uint uVar35;
  uint uVar39;
  uint uVar41;
  undefined1 auVar36 [16];
  uint uVar40;
  uint uVar42;
  uint uVar44;
  uint uVar45;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  int iVar73;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  uint local_114;
  int local_110;
  long local_f8;
  __m128i *local_e8;
  ulong local_d8;
  undefined1 local_58 [16];
  int iVar43;
  int iVar46;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_trace_striped_profile_sse2_128_32_cold_8();
  }
  else {
    pvVar6 = (profile->profile32).score;
    if (pvVar6 == (void *)0x0) {
      parasail_sw_trace_striped_profile_sse2_128_32_cold_7();
    }
    else {
      ppVar7 = profile->matrix;
      if (ppVar7 == (parasail_matrix_t *)0x0) {
        parasail_sw_trace_striped_profile_sse2_128_32_cold_6();
      }
      else {
        uVar5 = profile->s1Len;
        if ((int)uVar5 < 1) {
          parasail_sw_trace_striped_profile_sse2_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_trace_striped_profile_sse2_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_trace_striped_profile_sse2_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sw_trace_striped_profile_sse2_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_trace_striped_profile_sse2_128_32_cold_1();
        }
        else {
          uVar32 = (ulong)uVar5 + 3 >> 2;
          iVar22 = ppVar7->max;
          a = (uint)uVar32;
          result = parasail_result_new_trace(a,s2Len,0x10,0x10);
          if (result != (parasail_result_t *)0x0) {
            result->flag = result->flag | 0x4480804;
            b = parasail_memalign___m128i(0x10,uVar32);
            palVar18 = parasail_memalign___m128i(0x10,uVar32);
            b_00 = parasail_memalign___m128i(0x10,uVar32);
            palVar19 = parasail_memalign___m128i(0x10,uVar32);
            ptr = parasail_memalign___m128i(0x10,uVar32);
            ptr_00 = parasail_memalign___m128i(0x10,uVar32);
            local_e8 = parasail_memalign___m128i(0x10,uVar32);
            if (b == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar18 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar19 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_e8 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            c[1] = (longlong)palVar19;
            c[0] = uVar32;
            palVar23 = local_e8;
            parasail_memset___m128i(b,c,(size_t)local_e8);
            iVar31 = -open;
            c_00[1] = extraout_RDX;
            c_00[0] = uVar32;
            parasail_memset___m128i(b_00,c_00,(size_t)palVar23);
            c_01[1] = extraout_RDX_00;
            c_01[0] = uVar32;
            parasail_memset___m128i(palVar19,c_01,(size_t)palVar23);
            lVar26 = uVar32 * 0x10;
            lVar20 = 0;
            do {
              puVar2 = (undefined8 *)((long)((result->field_4).rowcols)->score_row + lVar20);
              *puVar2 = 0x800000008;
              puVar2[1] = 0x800000008;
              auVar17 = _DAT_008d28a0;
              auVar16 = _DAT_008d2890;
              auVar15 = _DAT_008d2510;
              auVar14 = _DAT_008d2500;
              auVar13 = _DAT_008d24f0;
              lVar20 = lVar20 + 0x10;
            } while (lVar26 != lVar20);
            local_d8 = 1;
            if (1 < s2Len) {
              local_d8 = (ulong)(uint)s2Len;
            }
            lVar20 = (ulong)(a + (a == 0)) << 4;
            local_114 = 0xc0000000;
            lVar28 = 0;
            local_110 = 0;
            auVar62 = (undefined1  [16])0x0;
            local_58 = (undefined1  [16])0x0;
            uVar24 = 0;
            local_f8 = lVar26;
            do {
              palVar23 = b;
              ptr_01 = ptr;
              ptr = palVar19;
              palVar19 = palVar23 + (a - 1);
              pvVar21 = (void *)(uVar32 * (long)ppVar7->mapper[(byte)s2[uVar24]] * 0x10 +
                                (long)pvVar6);
              b = palVar18;
              if (local_110 == (int)uVar24 + -2) {
                b = local_e8;
                local_e8 = palVar18;
              }
              palVar18 = palVar23 + (a - 1);
              iVar43 = (int)(*palVar18)[0];
              iVar46 = *(int *)((long)*palVar18 + 4);
              iVar73 = (int)(*palVar18)[1];
              iVar29 = 0;
              uVar1 = uVar24 + 1;
              uVar30 = 1;
              lVar27 = 0;
              auVar56._4_4_ = -open;
              auVar56._0_4_ = -open;
              auVar56._8_4_ = -open;
              auVar56._12_4_ = -open;
              do {
                piVar3 = (int *)((long)pvVar21 + lVar27);
                auVar69._0_4_ = iVar29 + *piVar3;
                auVar69._4_4_ = iVar43 + piVar3[1];
                auVar69._8_4_ = iVar46 + piVar3[2];
                auVar69._12_4_ = iVar73 + piVar3[3];
                auVar47 = *(undefined1 (*) [16])((long)*b_00 + lVar27);
                auVar36._0_4_ = -(uint)(0 < auVar69._0_4_);
                auVar36._4_4_ = -(uint)(0 < auVar69._4_4_);
                auVar36._8_4_ = -(uint)(0 < auVar69._8_4_);
                auVar36._12_4_ = -(uint)(0 < auVar69._12_4_);
                auVar36 = auVar36 & auVar69;
                auVar58._0_4_ = -(uint)(auVar47._0_4_ < auVar36._0_4_);
                auVar58._4_4_ = -(uint)(auVar47._4_4_ < auVar36._4_4_);
                auVar58._8_4_ = -(uint)(auVar47._8_4_ < auVar36._8_4_);
                auVar58._12_4_ = -(uint)(auVar47._12_4_ < auVar36._12_4_);
                auVar59 = ~auVar58 & auVar47 | auVar36 & auVar58;
                auVar74._0_4_ = -(uint)(auVar56._0_4_ < auVar59._0_4_);
                auVar74._4_4_ = -(uint)(auVar56._4_4_ < auVar59._4_4_);
                auVar74._8_4_ = -(uint)(auVar56._8_4_ < auVar59._8_4_);
                auVar74._12_4_ = -(uint)(auVar56._12_4_ < auVar59._12_4_);
                auVar69 = ~auVar74 & auVar56 | auVar59 & auVar74;
                *(undefined1 (*) [16])((long)*b + lVar27) = auVar69;
                iVar29 = auVar69._0_4_;
                uVar34 = -(uint)(auVar36._0_4_ == iVar29);
                iVar43 = auVar69._4_4_;
                uVar39 = -(uint)(auVar36._4_4_ == iVar43);
                iVar46 = auVar69._8_4_;
                uVar41 = -(uint)(auVar36._8_4_ == iVar46);
                iVar73 = auVar69._12_4_;
                uVar44 = -(uint)(auVar36._12_4_ == iVar73);
                uVar35 = ~uVar34 & auVar74._0_4_ + auVar15._0_4_ |
                         ~-(uint)(iVar29 == 0) & uVar34 & 4;
                uVar40 = ~uVar39 & auVar74._4_4_ + auVar15._4_4_ |
                         ~-(uint)(iVar43 == 0) & uVar39 & 4;
                uVar42 = ~uVar41 & auVar74._8_4_ + auVar15._8_4_ |
                         ~-(uint)(iVar46 == 0) & uVar41 & 4;
                uVar45 = ~uVar44 & auVar74._12_4_ + auVar15._12_4_ |
                         ~-(uint)(iVar73 == 0) & uVar44 & 4;
                puVar4 = (uint *)((long)((result->field_4).rowcols)->score_row + lVar27 + lVar28);
                uVar34 = *puVar4;
                uVar39 = puVar4[1];
                uVar41 = puVar4[2];
                uVar44 = puVar4[3];
                puVar4 = (uint *)((long)*ptr_00 + lVar27);
                *puVar4 = uVar35;
                puVar4[1] = uVar40;
                puVar4[2] = uVar42;
                puVar4[3] = uVar45;
                puVar4 = (uint *)((long)((result->field_4).rowcols)->score_row + lVar27 + lVar28);
                *puVar4 = uVar34 | uVar35;
                puVar4[1] = uVar39 | uVar40;
                puVar4[2] = uVar41 | uVar42;
                puVar4[3] = uVar44 | uVar45;
                auVar59._0_4_ = iVar29 - open;
                auVar59._4_4_ = iVar43 - open;
                auVar59._8_4_ = iVar46 - open;
                auVar59._12_4_ = iVar73 - open;
                auVar65._0_4_ = auVar47._0_4_ - gap;
                auVar65._4_4_ = auVar47._4_4_ - gap;
                auVar65._8_4_ = auVar47._8_4_ - gap;
                auVar65._12_4_ = auVar47._12_4_ - gap;
                auVar60._0_4_ = -(uint)(auVar65._0_4_ < auVar59._0_4_);
                auVar60._4_4_ = -(uint)(auVar65._4_4_ < auVar59._4_4_);
                auVar60._8_4_ = -(uint)(auVar65._8_4_ < auVar59._8_4_);
                auVar60._12_4_ = -(uint)(auVar65._12_4_ < auVar59._12_4_);
                *(undefined1 (*) [16])((long)*b_00 + lVar27) =
                     ~auVar60 & auVar65 | auVar59 & auVar60;
                piVar3 = (int *)((long)*ptr + lVar27);
                auVar66._0_4_ = *piVar3 - gap;
                auVar66._4_4_ = piVar3[1] - gap;
                auVar66._8_4_ = piVar3[2] - gap;
                auVar66._12_4_ = piVar3[3] - gap;
                auVar47._0_4_ = -(uint)(auVar66._0_4_ < auVar59._0_4_);
                auVar47._4_4_ = -(uint)(auVar66._4_4_ < auVar59._4_4_);
                auVar47._8_4_ = -(uint)(auVar66._8_4_ < auVar59._8_4_);
                auVar47._12_4_ = -(uint)(auVar66._12_4_ < auVar59._12_4_);
                *(undefined1 (*) [16])((long)*ptr_01 + lVar27) =
                     ~auVar47 & auVar66 | auVar59 & auVar47;
                if (uVar1 < (uint)s2Len) {
                  *(undefined1 (*) [16])
                   ((long)((result->field_4).rowcols)->score_row + lVar27 + local_f8) =
                       auVar47 & _DAT_008d24d0 ^ _DAT_008d24e0;
                }
                auVar64._0_4_ = auVar56._0_4_ - gap;
                auVar64._4_4_ = auVar56._4_4_ - gap;
                auVar64._8_4_ = auVar56._8_4_ - gap;
                auVar64._12_4_ = auVar56._12_4_ - gap;
                auVar55._0_4_ = -(uint)(auVar64._0_4_ < auVar59._0_4_);
                auVar55._4_4_ = -(uint)(auVar64._4_4_ < auVar59._4_4_);
                auVar55._8_4_ = -(uint)(auVar64._8_4_ < auVar59._8_4_);
                auVar55._12_4_ = -(uint)(auVar64._12_4_ < auVar59._12_4_);
                if (uVar30 < uVar32) {
                  piVar3 = ((result->field_4).rowcols)->score_row;
                  *(undefined1 (*) [16])((long)piVar3 + lVar27 + 0x10 + lVar28) =
                       auVar55 & auVar13 ^ auVar14 |
                       *(undefined1 (*) [16])((long)piVar3 + lVar27 + 0x10 + lVar28);
                }
                auVar48._0_4_ = -(uint)(auVar62._0_4_ < iVar29);
                auVar48._4_4_ = -(uint)(auVar62._4_4_ < iVar43);
                auVar48._8_4_ = -(uint)(auVar62._8_4_ < iVar46);
                auVar48._12_4_ = -(uint)(auVar62._12_4_ < iVar73);
                auVar62 = ~auVar48 & auVar62 | auVar69 & auVar48;
                auVar56 = ~auVar55 & auVar64 | auVar59 & auVar55;
                piVar3 = (int *)((long)*palVar23 + lVar27);
                iVar29 = *piVar3;
                iVar43 = piVar3[1];
                iVar46 = piVar3[2];
                iVar73 = piVar3[3];
                lVar27 = lVar27 + 0x10;
                uVar30 = uVar30 + 1;
              } while (lVar20 != lVar27);
              iVar29 = 0;
              auVar72 = auVar56;
              do {
                auVar9._4_8_ = auVar72._8_8_;
                auVar9._0_4_ = auVar72._0_4_;
                auVar70._0_8_ = auVar9._0_8_ << 0x20;
                auVar70._8_4_ = auVar72._4_4_;
                auVar70._12_4_ = auVar72._8_4_;
                auVar72._4_12_ = auVar70._4_12_;
                auVar72._0_4_ = iVar31;
                auVar10._4_8_ = auVar64._8_8_;
                auVar10._0_4_ = auVar64._0_4_;
                auVar63._0_8_ = auVar10._0_8_ << 0x20;
                auVar63._8_4_ = auVar64._4_4_;
                auVar63._12_4_ = auVar64._8_4_;
                auVar64._4_12_ = auVar63._4_12_;
                auVar64._0_4_ = 0xc0000000;
                auVar11._4_8_ = auVar56._8_8_;
                auVar11._0_4_ = auVar56._0_4_;
                auVar57._0_8_ = auVar11._0_8_ << 0x20;
                auVar57._8_4_ = auVar56._4_4_;
                auVar57._12_4_ = auVar56._8_4_;
                auVar56._4_12_ = auVar57._4_12_;
                auVar56._0_4_ = iVar31;
                auVar12._4_8_ = auVar59._8_8_;
                auVar12._0_4_ = auVar59._0_4_;
                auVar53._0_8_ = auVar12._0_8_ << 0x20;
                auVar53._8_4_ = auVar59._4_4_;
                auVar53._12_4_ = auVar59._8_4_;
                auVar59._4_12_ = auVar53._4_12_;
                auVar59._0_4_ = iVar31;
                iVar46 = (int)(*palVar19)[0];
                iVar73 = *(int *)((long)*palVar19 + 4);
                iVar61 = (int)(*palVar19)[1];
                iVar43 = 0;
                lVar27 = 0;
                do {
                  auVar47 = *(undefined1 (*) [16])((long)*b + lVar27);
                  auVar67._0_4_ = -(uint)(auVar56._0_4_ < auVar47._0_4_);
                  auVar67._4_4_ = -(uint)(auVar56._4_4_ < auVar47._4_4_);
                  auVar67._8_4_ = -(uint)(auVar56._8_4_ < auVar47._8_4_);
                  auVar67._12_4_ = -(uint)(auVar56._12_4_ < auVar47._12_4_);
                  auVar36 = ~auVar67 & auVar56 | auVar47 & auVar67;
                  *(undefined1 (*) [16])((long)*b + lVar27) = auVar36;
                  piVar3 = (int *)((long)pvVar21 + lVar27);
                  uVar34 = auVar36._0_4_;
                  auVar49._0_4_ =
                       -(uint)((-(uint)(0 < iVar43 + *piVar3) & iVar43 + *piVar3) == uVar34);
                  uVar39 = auVar36._4_4_;
                  auVar49._4_4_ =
                       -(uint)((-(uint)(0 < iVar46 + piVar3[1]) & iVar46 + piVar3[1]) == uVar39);
                  uVar41 = auVar36._8_4_;
                  auVar49._8_4_ =
                       -(uint)((-(uint)(0 < iVar73 + piVar3[2]) & iVar73 + piVar3[2]) == uVar41);
                  uVar44 = auVar36._12_4_;
                  auVar49._12_4_ =
                       -(uint)((-(uint)(0 < iVar61 + piVar3[3]) & iVar61 + piVar3[3]) == uVar44);
                  auVar47 = *(undefined1 (*) [16])
                             ((long)((result->field_4).rowcols)->score_row + lVar27 + lVar28);
                  auVar69 = ~(auVar49 | auVar67) & auVar15 |
                            *(undefined1 (*) [16])((long)*ptr_00 + lVar27) & (auVar49 | auVar67);
                  *(undefined1 (*) [16])((long)*ptr_00 + lVar27) = auVar69;
                  *(undefined1 (*) [16])
                   ((long)((result->field_4).rowcols)->score_row + lVar27 + lVar28) =
                       auVar69 | auVar47 & auVar16;
                  piVar3 = ((result->field_4).rowcols)->score_row;
                  auVar54._0_4_ = -(uint)(auVar64._0_4_ < auVar59._0_4_);
                  auVar54._4_4_ = -(uint)(auVar64._4_4_ < auVar59._4_4_);
                  auVar54._8_4_ = -(uint)(auVar64._8_4_ < auVar59._8_4_);
                  auVar54._12_4_ = -(uint)(auVar64._12_4_ < auVar59._12_4_);
                  *(undefined1 (*) [16])((long)piVar3 + lVar27 + lVar28) =
                       (*(undefined1 (*) [16])((long)piVar3 + lVar27 + lVar28) & auVar17 |
                       auVar54 & auVar13) ^ auVar14;
                  auVar59._0_4_ = uVar34 - open;
                  auVar59._4_4_ = uVar39 - open;
                  auVar59._8_4_ = uVar41 - open;
                  auVar59._12_4_ = uVar44 - open;
                  piVar3 = (int *)((long)*ptr + lVar27);
                  auVar50._0_4_ = *piVar3 - gap;
                  auVar50._4_4_ = piVar3[1] - gap;
                  auVar50._8_4_ = piVar3[2] - gap;
                  auVar50._12_4_ = piVar3[3] - gap;
                  auVar75._0_4_ = -(uint)(auVar50._0_4_ < auVar59._0_4_);
                  auVar75._4_4_ = -(uint)(auVar50._4_4_ < auVar59._4_4_);
                  auVar75._8_4_ = -(uint)(auVar50._8_4_ < auVar59._8_4_);
                  auVar75._12_4_ = -(uint)(auVar50._12_4_ < auVar59._12_4_);
                  *(undefined1 (*) [16])((long)*ptr_01 + lVar27) =
                       ~auVar75 & auVar50 | auVar59 & auVar75;
                  if (uVar1 < (uint)s2Len) {
                    *(undefined1 (*) [16])
                     ((long)((result->field_4).rowcols)->score_row + lVar27 + local_f8) =
                         auVar75 & _DAT_008d24d0 ^ _DAT_008d24e0;
                  }
                  auVar51._0_4_ = -(uint)(auVar62._0_4_ < (int)uVar34);
                  auVar51._4_4_ = -(uint)(auVar62._4_4_ < (int)uVar39);
                  auVar51._8_4_ = -(uint)(auVar62._8_4_ < (int)uVar41);
                  auVar51._12_4_ = -(uint)(auVar62._12_4_ < (int)uVar44);
                  auVar62 = ~auVar51 & auVar62 | auVar36 & auVar51;
                  auVar68._0_4_ = auVar56._0_4_ - gap;
                  auVar68._4_4_ = auVar56._4_4_ - gap;
                  auVar68._8_4_ = auVar56._8_4_ - gap;
                  auVar68._12_4_ = auVar56._12_4_ - gap;
                  auVar37._0_4_ = -(uint)(auVar68._0_4_ < auVar59._0_4_);
                  auVar37._4_4_ = -(uint)(auVar68._4_4_ < auVar59._4_4_);
                  auVar37._8_4_ = -(uint)(auVar68._8_4_ < auVar59._8_4_);
                  auVar37._12_4_ = -(uint)(auVar68._12_4_ < auVar59._12_4_);
                  bVar33 = (ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)((byte)(auVar37._12_4_ >> 7) & 1) << 0xc |
                                    (ushort)((byte)(auVar37._12_4_ >> 0xf) & 1) << 0xd |
                                    (ushort)((byte)(auVar37._12_4_ >> 0x17) & 1) << 0xe |
                                   (ushort)(byte)(auVar37._12_4_ >> 0x1f) << 0xf) == 0xffff;
                  bVar8 = !bVar33;
                  if (bVar33) {
                    iVar43 = 0x21;
                    goto LAB_00652252;
                  }
                  auVar64._0_4_ = auVar72._0_4_ - gap;
                  auVar64._4_4_ = auVar72._4_4_ - gap;
                  auVar64._8_4_ = auVar72._8_4_ - gap;
                  auVar64._12_4_ = auVar72._12_4_ - gap;
                  auVar71._0_4_ = -(uint)(auVar64._0_4_ < auVar59._0_4_);
                  auVar71._4_4_ = -(uint)(auVar64._4_4_ < auVar59._4_4_);
                  auVar71._8_4_ = -(uint)(auVar64._8_4_ < auVar59._8_4_);
                  auVar71._12_4_ = -(uint)(auVar64._12_4_ < auVar59._12_4_);
                  auVar72 = ~auVar71 & auVar64 | auVar59 & auVar71;
                  piVar3 = (int *)((long)*palVar23 + lVar27);
                  iVar43 = *piVar3;
                  iVar46 = piVar3[1];
                  iVar73 = piVar3[2];
                  iVar61 = piVar3[3];
                  lVar27 = lVar27 + 0x10;
                  auVar56 = auVar68;
                } while (lVar20 != lVar27);
                iVar43 = 0;
LAB_00652252:
                if (iVar43 != 0) {
                  if (iVar43 != 0x21) goto LAB_006522f6;
                  break;
                }
                iVar29 = iVar29 + 1;
              } while (iVar29 != 4);
              auVar38._0_4_ = -(uint)((int)local_58._0_4_ < auVar62._0_4_);
              auVar38._4_4_ = -(uint)((int)local_58._4_4_ < auVar62._4_4_);
              iVar43 = auVar62._8_4_;
              iVar46 = auVar62._12_4_;
              auVar38._8_4_ = -(uint)((int)local_58._8_4_ < iVar43);
              auVar38._12_4_ = -(uint)((int)local_58._12_4_ < iVar46);
              iVar29 = movmskps((int)pvVar21,auVar38);
              bVar8 = true;
              if (iVar29 != 0) {
                auVar52._0_4_ = -(uint)(iVar43 < auVar62._0_4_);
                auVar52._4_4_ = -(uint)(iVar46 < auVar62._4_4_);
                auVar52._8_4_ = -(uint)(0 < iVar43);
                auVar52._12_4_ = -(uint)(0 < iVar46);
                auVar56 = ~auVar52 & auVar62 >> 0x40 | auVar62 & auVar52;
                uVar34 = auVar56._0_4_;
                uVar41 = auVar56._4_4_;
                uVar39 = -(uint)((int)uVar41 < (int)uVar34);
                local_114 = ~uVar39 & uVar41 | uVar34 & uVar39;
                if (0x7ffffffe - iVar22 < (int)local_114) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                  bVar8 = false;
                }
                else {
                  local_58._4_4_ = local_114;
                  local_58._0_4_ = local_114;
                  local_58._8_4_ = local_114;
                  local_58._12_4_ = local_114;
                  local_110 = (int)uVar24;
                }
              }
LAB_006522f6:
              if (!bVar8) {
                local_d8 = uVar24 & 0xffffffff;
                goto LAB_00652324;
              }
              local_f8 = local_f8 + lVar26;
              lVar28 = lVar28 + lVar26;
              palVar19 = ptr_01;
              uVar24 = uVar1;
              palVar18 = palVar23;
              if (uVar1 == local_d8) {
LAB_00652324:
                if (local_114 == 0x7fffffff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar31 = parasail_result_is_saturated(result);
                iVar22 = 0;
                palVar19 = b;
                if (iVar31 == 0) {
                  palVar25 = palVar23;
                  palVar18 = local_e8;
                  if (local_110 == (int)local_d8 + -2) {
                    palVar25 = local_e8;
                    palVar18 = palVar23;
                  }
                  if (local_110 == (int)local_d8 + -1) {
                    palVar19 = local_e8;
                    palVar18 = b;
                    palVar25 = palVar23;
                  }
                  palVar23 = palVar25;
                  local_e8 = palVar18;
                  iVar22 = uVar5 - 1;
                  if (((ulong)uVar5 + 3 & 0x7ffffffc) != 0) {
                    uVar32 = 0;
                    do {
                      if ((*(uint *)((long)*local_e8 + uVar32 * 4) == local_114) &&
                         (iVar31 = ((uint)uVar32 & 3) * a + ((uint)(uVar32 >> 2) & 0x3fffffff),
                         iVar31 < iVar22)) {
                        iVar22 = iVar31;
                      }
                      uVar32 = uVar32 + 1;
                    } while ((a & 0x1fffffff) << 2 != (int)uVar32);
                  }
                }
                else {
                  local_114 = 0;
                  local_110 = 0;
                }
                result->score = local_114;
                result->end_query = iVar22;
                result->end_ref = local_110;
                parasail_free(local_e8);
                parasail_free(ptr_00);
                parasail_free(ptr);
                parasail_free(ptr_01);
                parasail_free(b_00);
                parasail_free(palVar23);
                parasail_free(palVar19);
                return result;
              }
            } while( true );
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int32_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int32_t maxp = 0;
    parasail_result_t *result = NULL;
    __m128i vTZero;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    vZero = _mm_setzero_si128();
    score = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    vTZero = _mm_set1_epi32(PARASAIL_ZERO);
    vTIns  = _mm_set1_epi32(PARASAIL_INS);
    vTDel  = _mm_set1_epi32(PARASAIL_DEL);
    vTDiag = _mm_set1_epi32(PARASAIL_DIAG);
    vTDiagE= _mm_set1_epi32(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi32(PARASAIL_INS_E);
    vTDiagF= _mm_set1_epi32(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi32(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi32(PARASAIL_ZERO_MASK);
    vFTMask= _mm_set1_epi32(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!pvHMax) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi32(-open), segLen);
    parasail_memset___m128i(pvEaStore, _mm_set1_epi32(-open), segLen);

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = _mm_sub_epi32(vZero,vGapO);

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi32_rpl(vH_dag, vZero);
            vH = _mm_max_epi32_rpl(vH_dag, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i cond_zero = _mm_cmpeq_epi32(vH, vZero);
                __m128i case1 = _mm_cmpeq_epi32(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi32(vH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        _mm_blendv_epi8_rpl(vTDiag, vTZero, cond_zero),
                        case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32_rpl(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_sub_epi32(vEa, vGapE);
                vEa = _mm_max_epi32_rpl(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi32(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 4);
            vEF_opn = _mm_slli_si128(vEF_opn, 4);
            vEF_opn = _mm_insert_epi32_rpl(vEF_opn, -open, 0);
            vF_ext = _mm_slli_si128(vF_ext, 4);
            vF_ext = _mm_insert_epi32_rpl(vF_ext, NEG_INF, 0);
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, -open, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 4);
            vFa_ext = _mm_insert_epi32_rpl(vFa_ext, NEG_INF, 0);
            vFa = _mm_slli_si128(vFa, 4);
            vFa = _mm_insert_epi32_rpl(vFa, -open, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                    vHp = _mm_max_epi32_rpl(vHp, vZero);
                    case1 = _mm_cmpeq_epi32(vH, vHp);
                    case2 = _mm_cmpeq_epi32(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8_rpl(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi32(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_sub_epi32(vEa, vGapE);
                    vEa = _mm_max_epi32_rpl(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi32(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_sub_epi32(vFa, vGapE);
                vFa = _mm_max_epi32_rpl(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvHMax);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}